

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syslog.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  LogSyslog *this;
  
  this = (LogSyslog *)operator_new(8);
  liblogger::LogSyslog::LogSyslog(this);
  liblogger::LogManager::Add((ILogger *)this);
  liblogger::LogManager::PrintAll();
  liblogger::LogDebug("Debug Logging #1");
  liblogger::LogDebug("Debug Logging #%d",2);
  liblogger::LogInfo("Info Logging #1");
  liblogger::LogInfo("Info Logging #%d",2);
  liblogger::LogNotice("Notice Logging #1");
  liblogger::LogNotice("%s Logging #2","Notice");
  liblogger::LogWarning("Warning!!!!!!");
  liblogger::LogWarning("Warning!!!!!! #%d",2);
  liblogger::LogError("This is an Error");
  liblogger::LogError("This is an Error %d",2);
  liblogger::LogError("Something Critical happened");
  liblogger::LogError("Something Critical happened %s","Really BAD!");
  liblogger::LogAlert("Alert Alert");
  liblogger::LogAlert("Alert Alert %s","Alert");
  liblogger::LogCritical("TestLog Critical!");
  liblogger::LogEmergency("TestLog Emergency!");
  liblogger::LogManager::RemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogSyslog());

	examples();

	LogManager::RemoveAll();
	return 0;
}